

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O2

void Gia_ManProfileStructures(Gia_Man_t *p,int nLimit,int fVerbose)

{
  Gia_Man_t *p_00;
  
  if (p->pMuxes != (uint *)0x0) {
    Gia_ManProfileStructuresInt(p,nLimit,fVerbose);
    return;
  }
  p_00 = Gia_ManDupMuxes(p,2);
  Gia_ManProfileStructuresInt(p_00,nLimit,fVerbose);
  Gia_ManStop(p_00);
  return;
}

Assistant:

void Gia_ManProfileStructures( Gia_Man_t * p, int nLimit, int fVerbose )
{
    if ( p->pMuxes )
        Gia_ManProfileStructuresInt( p, nLimit, fVerbose );
    else
    {
        Gia_Man_t * pNew = Gia_ManDupMuxes( p, 2 );
        Gia_ManProfileStructuresInt( pNew, nLimit, fVerbose );
        Gia_ManStop( pNew );
    }
}